

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaPrecision.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4>::iterate
          (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4> *this)

{
  ostringstream *this_00;
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  deUint32 dVar15;
  deRoundingMode mode;
  undefined4 extraout_var;
  void *pvVar16;
  long lVar17;
  float *pfVar18;
  char *description;
  int iVar19;
  qpTestResult testResult;
  undefined1 *puVar20;
  TestContext *this_01;
  float *pfVar21;
  GLuint i;
  long lVar22;
  int iVar23;
  int iVar24;
  GLfloat resultCPURTZ [400];
  GLfloat resultCPURNE [400];
  GLfloat resultFma [400];
  GLfloat resultStd [400];
  undefined1 local_1ab8 [120];
  ios_base local_1a40 [264];
  float local_1938 [1200];
  undefined1 local_678 [1608];
  
  initTest(this);
  iVar14 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar14);
  (**(code **)(lVar17 + 0x30))(0);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"glBeginTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x112);
  (**(code **)(lVar17 + 0x538))(0,0,100);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x115);
  (**(code **)(lVar17 + 0x638))();
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x118);
  (**(code **)(lVar17 + 0x40))(0x8c8e,this->m_vbo_result_fma_id);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x120);
  pvVar16 = (void *)(**(code **)(lVar17 + 0xd00))(0x8c8e,0,0x640,1);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x124);
  memcpy(local_1938 + 800,pvVar16,0x640);
  (**(code **)(lVar17 + 0x1670))(0x8c8e);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x129);
  (**(code **)(lVar17 + 0x40))(0x8c8e,this->m_vbo_result_std_id);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,300);
  pvVar16 = (void *)(**(code **)(lVar17 + 0xd00))(0x8c8e,0,0x640,1);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x130);
  memcpy(local_678,pvVar16,0x640);
  (**(code **)(lVar17 + 0x1670))(0x8c8e);
  dVar15 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar15,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x135);
  mode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  lVar17 = -0x640;
  do {
    pfVar18 = (float *)((long)this->m_data_b + lVar17);
    fVar2 = pfVar18[1];
    fVar3 = pfVar18[2];
    fVar4 = pfVar18[3];
    pfVar21 = (float *)((long)this->m_data_c + lVar17);
    fVar5 = pfVar21[1];
    fVar6 = pfVar21[2];
    fVar7 = pfVar21[3];
    pfVar1 = (float *)((long)&this->m_fs_id + lVar17);
    fVar8 = pfVar1[1];
    fVar9 = pfVar1[2];
    fVar10 = pfVar1[3];
    *(float *)((long)local_1938 + lVar17 + 0xc80) = *pfVar1 + *pfVar21 * *pfVar18;
    *(float *)((long)local_1938 + lVar17 + 0xc84) = fVar8 + fVar5 * fVar2;
    *(float *)((long)local_1938 + lVar17 + 0xc88) = fVar9 + fVar6 * fVar3;
    *(float *)((long)local_1938 + lVar17 + 0xc8c) = fVar10 + fVar7 * fVar4;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0);
  deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
  lVar17 = -0x640;
  do {
    pfVar18 = (float *)((long)this->m_data_b + lVar17);
    fVar2 = pfVar18[1];
    fVar3 = pfVar18[2];
    fVar4 = pfVar18[3];
    pfVar21 = (float *)((long)this->m_data_c + lVar17);
    fVar5 = pfVar21[1];
    fVar6 = pfVar21[2];
    fVar7 = pfVar21[3];
    pfVar1 = (float *)((long)&this->m_fs_id + lVar17);
    fVar8 = pfVar1[1];
    fVar9 = pfVar1[2];
    fVar10 = pfVar1[3];
    *(float *)((long)local_1938 + lVar17 + 0x640) = *pfVar1 + *pfVar21 * *pfVar18;
    *(float *)((long)local_1938 + lVar17 + 0x644) = fVar8 + fVar5 * fVar2;
    *(float *)((long)local_1938 + lVar17 + 0x648) = fVar9 + fVar6 * fVar3;
    *(float *)((long)local_1938 + lVar17 + 0x64c) = fVar10 + fVar7 * fVar4;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0);
  deSetRoundingMode(mode);
  bVar12 = 1;
  pfVar18 = local_1938 + 400;
LAB_00cb7611:
  pfVar21 = local_1938 + 800;
  lVar17 = 0;
  bVar11 = true;
  puVar20 = local_678;
  do {
    lVar22 = 0;
    do {
      iVar19 = (int)pfVar18[lVar22] - (int)pfVar21[lVar22];
      iVar14 = -iVar19;
      if (0 < iVar19) {
        iVar14 = iVar19;
      }
      iVar23 = (int)pfVar18[lVar22] - *(int *)(puVar20 + lVar22 * 4);
      iVar19 = -iVar23;
      if (0 < iVar23) {
        iVar19 = iVar23;
      }
      iVar24 = (int)pfVar21[lVar22] - *(int *)(puVar20 + lVar22 * 4);
      iVar23 = -iVar24;
      if (0 < iVar24) {
        iVar23 = iVar24;
      }
      if (((2 < iVar23) || (2 < iVar14)) || (2 < iVar19)) {
        bVar13 = (bool)(bVar12 & bVar11);
        bVar12 = 0;
        pfVar18 = local_1938;
        if (bVar13) goto LAB_00cb7611;
        if (!bVar11) goto LAB_00cb7724;
        local_1ab8._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1ab8 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
                   ,100);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"are not bitwise equal for i = 0..99\n",0x24);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ab8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_1a40);
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Fail";
        testResult = QP_TEST_RESULT_FAIL;
        goto LAB_00cb7731;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 4);
    lVar17 = lVar17 + 1;
    pfVar18 = pfVar18 + 4;
    pfVar21 = pfVar21 + 4;
    puVar20 = puVar20 + 0x10;
    bVar11 = false;
    if (lVar17 == 100) {
LAB_00cb7724:
      this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00cb7731:
      tcu::TestContext::setTestResult(this_01,testResult,description);
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5FmaPrecision<S>::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");

	gl.drawArrays(GL_POINTS, 0, m_n_elements);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Retrieve the result data */
	glw::GLfloat		resultFma[m_n_elements * S];
	glw::GLfloat		resultStd[m_n_elements * S];
	const glw::GLfloat* resultTmp = DE_NULL;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_fma_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultFma, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_std_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultStd, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	/* Execute the algorithm from shader on CPU */
	glw::GLfloat resultCPURNE[m_n_elements * S];
	glw::GLfloat resultCPURTZ[m_n_elements * S];

	deRoundingMode previousRoundingMode = deGetRoundingMode();

	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURNE[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURTZ[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	/* Restore the rounding mode so subsequent tests aren't affected */
	deSetRoundingMode(previousRoundingMode);

	/* Check results */
	const glw::GLfloat* resultsCPU[] = { resultCPURNE, resultCPURTZ };
	FloatConverter		cpuU;
	FloatConverter		fmaU;
	FloatConverter		stdU;
	glw::GLboolean		test_failed = true;

	for (glw::GLuint roundingMode = 0; test_failed && roundingMode < 2; ++roundingMode)
	{
		glw::GLboolean rounding_mode_failed = false;
		for (glw::GLuint i = 0; i < m_n_elements; ++i)
		{
			for (int j = 0; j < S; ++j)
			{
				/* Assign float value to the union */
				cpuU.m_float = resultsCPU[roundingMode][i * S + j];
				fmaU.m_float = resultFma[i * S + j];
				stdU.m_float = resultStd[i * S + j];

				/* Convert float to int bitwise */
				glw::GLint cpuTemp = cpuU.m_int;
				glw::GLint fmaTemp = fmaU.m_int;
				glw::GLint stdTemp = stdU.m_int;

				glw::GLboolean diffCpuFma = de::abs(cpuTemp - fmaTemp) > 2;
				glw::GLboolean diffCpuStd = de::abs(cpuTemp - stdTemp) > 2;
				glw::GLboolean diffFmaStd = de::abs(fmaTemp - stdTemp) > 2;

				if (diffCpuFma || diffCpuStd || diffFmaStd)
				{
					rounding_mode_failed = true;
					break;
				}
			}

			if (rounding_mode_failed)
			{
				break;
			}
			else
			{
				test_failed = false;
			}
		} /* for (all elements) */
	}	 /* for (all rounding modes) */

	if (test_failed)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
			<< "are not bitwise equal for i = 0..99\n"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}